

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_complib.c
# Opt level: O2

int load_and_compile_file(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  char *options;
  char *fmt;
  char errmsg [1024];
  
  fmt = errmsg;
  pcVar2 = luaL_checklstring(L,1,(size_t *)0x0);
  iVar1 = lua_isstring(L,2);
  if (iVar1 == 0) {
    options = "";
  }
  else {
    options = luaL_checklstring(L,2,(size_t *)0x0);
  }
  errmsg[0] = '\0';
  pcVar2 = read_file(pcVar2,errmsg,0x400);
  if (pcVar2 != (char *)0x0) {
    iVar1 = load_and_compile_internal(L,pcVar2,options);
    free(pcVar2);
    if (iVar1 != 0) {
      return 1;
    }
    fmt = "Failed to compile";
  }
  luaL_error(L,fmt);
  return 0;
}

Assistant:

static int load_and_compile_file(lua_State* L) {
  const char* fname = luaL_checkstring(L, 1);
  const char* options = "";
  if (lua_isstring(L, 2)) {
    options = luaL_checkstring(L, 2);
  }
  char errmsg[1024];
  errmsg[0] = 0;
  const char* s = read_file(fname, errmsg, sizeof errmsg);
  if (s == NULL) {
    luaL_error(L, errmsg);
    return 0;
  }
  // FIXME we should use pcall here
  int rc = load_and_compile_internal(L, s, options);
  free((void*)s);
  if (rc == 0) {
    luaL_error(L, "Failed to compile");
  }
  return rc;
}